

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubD *subd,ON_SimpleArray<ON_COMPONENT_INDEX> *unsorted_edges,
               uint minimum_chain_length,ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  ulong new_capacity;
  ON_SubDEdge *e;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  new_capacity = (ulong)(uint)unsorted_edges->m_count;
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828e30;
  local_48.m_a = (ON_SubDEdge **)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  if (new_capacity != 0) {
    ON_SimpleArray<const_ON_SubDEdge_*>::SetCapacity(&local_48,new_capacity);
    uVar2 = 0;
    do {
      local_50 = ON_SubD::EdgeFromComponentIndex(subd,unsorted_edges->m_a[uVar2]);
      if (local_50 != (ON_SubDEdge *)0x0) {
        ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
      }
      uVar2 = uVar2 + 1;
    } while (new_capacity != uVar2);
  }
  uVar1 = SortEdgesIntoEdgeChains(&local_48,minimum_chain_length,sorted_edges,false);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar1;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubD& subd,
  const ON_SimpleArray< ON_COMPONENT_INDEX >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDEdge* e = subd.EdgeFromComponentIndex(unsorted_edges[i]);
    if (nullptr != e)
      a.Append(e);
  }
  return SortEdgesIntoEdgeChains(a, minimum_chain_length, sorted_edges);
}